

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O3

void * floor1_inverse1(vorbis_block *vb,vorbis_look_floor *in)

{
  oggpack_buffer *b;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  undefined4 *puVar6;
  long lVar7;
  byte bVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  int local_74;
  
  piVar1 = *(int **)((long)in + 0x308);
  lVar9 = *(long *)((long)vb->vd->vi->codec_setup + 0x1428);
  b = &vb->opb;
  lVar5 = oggpack_read(b,1);
  if (lVar5 == 1) {
    puVar6 = (undefined4 *)_vorbis_block_alloc(vb,(long)*(int *)((long)in + 0x2fc) << 2);
    uVar3 = *(int *)((long)in + 0x304) - 1;
    uVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    iVar10 = (uVar2 ^ 0xffffffe0) + 0x21;
    if (uVar3 == 0) {
      iVar10 = 0;
    }
    lVar5 = oggpack_read(b,iVar10);
    *puVar6 = (int)lVar5;
    uVar3 = *(int *)((long)in + 0x304) - 1;
    uVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    iVar10 = (uVar2 ^ 0xffffffe0) + 0x21;
    if (uVar3 == 0) {
      iVar10 = 0;
    }
    lVar5 = oggpack_read(b,iVar10);
    puVar6[1] = (int)lVar5;
    if (0 < *piVar1) {
      local_74 = 2;
      lVar5 = 0;
      do {
        lVar16 = (long)piVar1[lVar5 + 1];
        uVar2 = piVar1[lVar16 + 0x20];
        iVar10 = piVar1[lVar16 + 0x30];
        uVar14 = 0;
        if ((iVar10 != 0) &&
           (uVar14 = vorbis_book_decode((codebook *)((long)piVar1[lVar16 + 0x40] * 0x60 + lVar9),b),
           (int)uVar14 == -1)) goto LAB_001219d5;
        if (0 < (int)uVar2) {
          bVar8 = (byte)iVar10;
          uVar15 = 0;
          do {
            uVar3 = (uint)uVar14;
            uVar14 = (ulong)(uint)((int)uVar3 >> (bVar8 & 0x1f));
            if ((long)piVar1[lVar16 * 8 + (ulong)(uVar3 & ~(-1 << (bVar8 & 0x1f))) + 0x50] < 0) {
              puVar6[(long)local_74 + uVar15] = 0;
            }
            else {
              lVar7 = vorbis_book_decode((codebook *)
                                         ((long)piVar1[lVar16 * 8 +
                                                       (ulong)(uVar3 & ~(-1 << (bVar8 & 0x1f))) +
                                                       0x50] * 0x60 + lVar9),b);
              puVar6[(long)local_74 + uVar15] = (int)lVar7;
              if ((int)lVar7 == -1) goto LAB_001219d5;
            }
            uVar15 = uVar15 + 1;
          } while (uVar2 != uVar15);
        }
        local_74 = uVar2 + local_74;
        lVar5 = lVar5 + 1;
      } while (lVar5 < *piVar1);
    }
    if (2 < *(int *)((long)in + 0x2fc)) {
      lVar9 = 0;
      do {
        lVar5 = (long)*(int *)((long)in + lVar9 * 4 + 0x200);
        lVar16 = (long)*(int *)((long)in + lVar9 * 4 + 0x104);
        iVar11 = (puVar6[lVar16] & 0x7fff) - (puVar6[lVar5] & 0x7fff);
        iVar10 = -iVar11;
        if (0 < iVar11) {
          iVar10 = iVar11;
        }
        iVar4 = ((piVar1[lVar9 + 0xd3] - piVar1[lVar5 + 0xd1]) * iVar10) /
                (piVar1[lVar16 + 0xd1] - piVar1[lVar5 + 0xd1]);
        iVar10 = -iVar4;
        if (-1 < iVar11) {
          iVar10 = iVar4;
        }
        uVar3 = iVar10 + (puVar6[lVar5] & 0x7fff);
        uVar2 = puVar6[lVar9 + 2];
        if (uVar2 == 0) {
          puVar6[lVar9 + 2] = uVar3 | 0x8000;
        }
        else {
          uVar12 = *(int *)((long)in + 0x304) - uVar3;
          uVar13 = uVar3;
          if ((int)uVar12 < (int)uVar3) {
            uVar13 = uVar12;
          }
          if (SBORROW4(uVar2,uVar13 * 2) == (int)(uVar2 + uVar13 * -2) < 0) {
            if ((int)uVar3 < (int)uVar12) {
              iVar10 = uVar2 - uVar3;
            }
            else {
              iVar10 = ~uVar2 + uVar12;
            }
          }
          else if ((uVar2 & 1) == 0) {
            iVar10 = (int)uVar2 >> 1;
          }
          else {
            iVar10 = -((int)(uVar2 + 1) >> 1);
          }
          puVar6[lVar9 + 2] = iVar10 + uVar3;
          puVar6[*(int *)((long)in + lVar9 * 4 + 0x200)] =
               puVar6[*(int *)((long)in + lVar9 * 4 + 0x200)] & 0x7fff;
          puVar6[*(int *)((long)in + lVar9 * 4 + 0x104)] =
               puVar6[*(int *)((long)in + lVar9 * 4 + 0x104)] & 0x7fff;
        }
        lVar5 = lVar9 + 3;
        lVar9 = lVar9 + 1;
      } while (lVar5 < *(int *)((long)in + 0x2fc));
    }
  }
  else {
LAB_001219d5:
    puVar6 = (undefined4 *)0x0;
  }
  return puVar6;
}

Assistant:

static void *floor1_inverse1(vorbis_block *vb,vorbis_look_floor *in){
  vorbis_look_floor1 *look=(vorbis_look_floor1 *)in;
  vorbis_info_floor1 *info=look->vi;
  codec_setup_info   *ci=(codec_setup_info *)vb->vd->vi->codec_setup;
  
  int i,j,k;
  codebook *books=ci->fullbooks;   
  
  /* unpack wrapped/predicted values from stream */
  if(oggpack_read(&vb->opb,1)==1){
    int *fit_value=(int *)_vorbis_block_alloc(vb,(look->posts)*sizeof(*fit_value));
    
    fit_value[0]=oggpack_read(&vb->opb,ilog(look->quant_q-1));
    fit_value[1]=oggpack_read(&vb->opb,ilog(look->quant_q-1));
    
    /* partition by partition */
    /* partition by partition */
    for(i=0,j=2;i<info->partitions;i++){
      int classv=info->partitionclass[i];
      int cdim=info->class_dim[classv];
      int csubbits=info->class_subs[classv];
      int csub=1<<csubbits;
      int cval=0;

      /* decode the partition's first stage cascade value */
      if(csubbits){
	cval=vorbis_book_decode(books+info->class_book[classv],&vb->opb);

	if(cval==-1)goto eop;
      }

      for(k=0;k<cdim;k++){
	int book=info->class_subbook[classv][cval&(csub-1)];
	cval>>=csubbits;
	if(book>=0){
	  if((fit_value[j+k]=vorbis_book_decode(books+book,&vb->opb))==-1)
	    goto eop;
	}else{
	  fit_value[j+k]=0;
	}
      }
      j+=cdim;
    }

    /* unwrap positive values and reconsitute via linear interpolation */
    for(i=2;i<look->posts;i++){
      int predicted=render_point(info->postlist[look->loneighbor[i-2]],
				 info->postlist[look->hineighbor[i-2]],
				 fit_value[look->loneighbor[i-2]],
				 fit_value[look->hineighbor[i-2]],
				 info->postlist[i]);
      int hiroom=look->quant_q-predicted;
      int loroom=predicted;
      int room=(hiroom<loroom?hiroom:loroom)<<1;
      int val=fit_value[i];

      if(val){
	if(val>=room){
	  if(hiroom>loroom){
	    val = val-loroom;
	  }else{
	  val = -1-(val-hiroom);
	  }
	}else{
	  if(val&1){
	    val= -((val+1)>>1);
	  }else{
	    val>>=1;
	  }
	}

	fit_value[i]=val+predicted;
	fit_value[look->loneighbor[i-2]]&=0x7fff;
	fit_value[look->hineighbor[i-2]]&=0x7fff;

      }else{
	fit_value[i]=predicted|0x8000;
      }
	
    }

    return(fit_value);
  }
 eop:
  return(NULL);
}